

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::builtins::ArrayLocatorMethod::eval
          (ArrayLocatorMethod *this,EvalContext *context,Args *args,SourceRange param_4,
          SystemCallInfo *callInfo)

{
  bool bVar1;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RCX;
  SVQueue *in_RSI;
  ConstantValue *in_RDI;
  pair<const_slang::ast::Expression_*,_const_slang::ast::ValueSymbol_*> pVar2;
  anon_class_16_2_39bd08df find;
  anon_class_40_5_248569b6 doFind_1;
  AssociativeArray *cont;
  anon_class_40_5_248569b6 doFind;
  SVQueue results;
  ConstantValue *iterVal;
  ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_ast_EvalContext_h:113:13)>
  guard;
  type *iterVar;
  type *iterExpr;
  ConstantValue arr;
  AssociativeArray *in_stack_fffffffffffffda8;
  EvalContext *in_stack_fffffffffffffdb0;
  SVQueue *in_stack_fffffffffffffdb8;
  SystemCallInfo *in_stack_fffffffffffffdc0;
  vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *in_stack_fffffffffffffdd8;
  anon_class_16_2_39bd08df *in_stack_fffffffffffffde0;
  ValueSymbol *in_stack_fffffffffffffde8;
  undefined7 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf7;
  EvalContext *in_stack_fffffffffffffe08;
  anon_class_40_5_248569b6 *this_00;
  anon_class_40_5_248569b6 *this_01;
  pair<const_slang::ast::Expression_*,_const_slang::ast::ValueSymbol_*> local_78;
  undefined4 local_68;
  anon_class_40_5_248569b6 local_58 [2];
  
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RCX,0);
  this_01 = local_58;
  Expression::eval((Expression *)in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
  bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x13126b0);
  if (bVar1) {
    pVar2 = CallExpression::SystemCallInfo::getIteratorInfo(in_stack_fffffffffffffdc0);
    this_00 = (anon_class_40_5_248569b6 *)&local_78;
    local_78 = pVar2;
    std::get<0ul,slang::ast::Expression_const*,slang::ast::ValueSymbol_const*>
              ((pair<const_slang::ast::Expression_*,_const_slang::ast::ValueSymbol_*> *)0x1312747);
    std::get<1ul,slang::ast::Expression_const*,slang::ast::ValueSymbol_const*>
              ((pair<const_slang::ast::Expression_*,_const_slang::ast::ValueSymbol_*> *)0x1312759);
    EvalContext::disableCaching(in_stack_fffffffffffffe08);
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    EvalContext::createLocal
              ((EvalContext *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
               in_stack_fffffffffffffde8,(ConstantValue *)in_stack_fffffffffffffde0);
    slang::ConstantValue::~ConstantValue((ConstantValue *)0x13127d3);
    SVQueue::SVQueue((SVQueue *)in_stack_fffffffffffffdb0);
    bVar1 = slang::ConstantValue::isMap((ConstantValue *)0x13127fc);
    if (bVar1) {
      slang::ConstantValue::map((ConstantValue *)0x131286f);
      CopyPtr<slang::AssociativeArray>::operator*((CopyPtr<slang::AssociativeArray> *)0x1312880);
      if (*(int *)&(in_RSI->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                   ).super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
                   _M_impl.super__Deque_impl_data._M_finish._M_first == 2) {
        std::rbegin<slang::AssociativeArray>(in_stack_fffffffffffffda8);
        std::rend<slang::AssociativeArray>(in_stack_fffffffffffffda8);
        const::{lambda(auto:1,auto:2)#1}::operator()
                  (this_01,(reverse_iterator<std::_Rb_tree_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
                            *)in_RSI,
                   (reverse_iterator<std::_Rb_tree_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
                    *)in_RDI);
      }
      else {
        std::begin<slang::AssociativeArray>(in_stack_fffffffffffffda8);
        std::end<slang::AssociativeArray>(in_stack_fffffffffffffda8);
        const::{lambda(auto:1,auto:2)#1}::operator()
                  (this_00,(_Base_ptr)pVar2.first,(_Base_ptr)pVar2.second);
      }
    }
    else {
      bVar1 = slang::ConstantValue::isQueue((ConstantValue *)0x1312a3d);
      if (bVar1) {
        in_stack_fffffffffffffdc0 =
             (SystemCallInfo *)slang::ConstantValue::queue((ConstantValue *)0x1312a5a);
        in_stack_fffffffffffffdb8 =
             CopyPtr<slang::SVQueue>::operator*((CopyPtr<slang::SVQueue> *)0x1312a6b);
        const::{lambda(auto:1&)#1}::operator()((anon_class_16_2_39bd08df *)this_01,in_RSI);
      }
      else {
        slang::ConstantValue::getVariant_abi_cxx11_((ConstantValue *)local_58);
        in_stack_fffffffffffffdb0 =
             (EvalContext *)
             std::
             get<std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                       ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         *)0x1312a9d);
        const::{lambda(auto:1&)#1}::operator()(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
      }
    }
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    local_68 = 1;
    SVQueue::~SVQueue((SVQueue *)0x1312aeb);
    ScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/../include/slang/ast/EvalContext.h:113:13)>
    ::~ScopeGuard((ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_ast_EvalContext_h:113:13)>
                   *)in_stack_fffffffffffffdb0);
  }
  else {
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    local_68 = 1;
  }
  slang::ConstantValue::~ConstantValue((ConstantValue *)0x1312b16);
  return in_RDI;
}

Assistant:

ConstantValue eval(EvalContext& context, const Args& args, SourceRange,
                       const CallExpression::SystemCallInfo& callInfo) const final {
        ConstantValue arr = args[0]->eval(context);
        if (!arr)
            return nullptr;

        auto [iterExpr, iterVar] = callInfo.getIteratorInfo();
        auto guard = context.disableCaching();
        auto iterVal = context.createLocal(iterVar);

        SVQueue results;
        if (arr.isMap()) {
            auto doFind = [&, ie = iterExpr](auto it, auto end) {
                for (; it != end; it++) {
                    *iterVal = it->second;
                    ConstantValue cv = ie->eval(context);
                    if (cv.isTrue()) {
                        if (isIndexed)
                            results.emplace_back(it->first);
                        else
                            results.emplace_back(it->second);

                        if (mode != All)
                            break;
                    }
                }
            };

            auto& cont = *arr.map();
            if (mode == Last)
                doFind(std::rbegin(cont), std::rend(cont));
            else
                doFind(std::begin(cont), std::end(cont));
        }
        else {
            auto doFind = [&, ie = iterExpr](auto begin, auto end) {
                for (auto it = begin; it != end; it++) {
                    *iterVal = *it;
                    ConstantValue cv = ie->eval(context);
                    if (cv.isTrue()) {
                        if (isIndexed) {
                            auto dist = std::ranges::distance(begin, it);
                            if (mode == Last)
                                dist = std::ranges::distance(begin, end) - dist - 1;

                            results.emplace_back(SVInt(32, (uint64_t)dist, true));
                        }
                        else {
                            results.emplace_back(*it);
                        }

                        if (mode != All)
                            break;
                    }
                }
            };

            auto find = [&](auto& cont) {
                if (mode == Last)
                    doFind(std::rbegin(cont), std::rend(cont));
                else
                    doFind(std::begin(cont), std::end(cont));
            };

            if (arr.isQueue())
                find(*arr.queue());
            else
                find(std::get<ConstantValue::Elements>(arr.getVariant()));
        }

        return results;
    }